

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool operator!=(ON_SurfaceDraftAngleColorMapping *lhs,ON_SurfaceDraftAngleColorMapping *rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  undefined7 extraout_var;
  ON_3dVector up [2];
  ON_3dVector local_48;
  ON_3dVector local_30;
  
  local_48.z = (lhs->m_up).z;
  local_48.x = (lhs->m_up).x;
  local_48.y = (lhs->m_up).y;
  local_30.x = (rhs->m_up).x;
  local_30.y = (rhs->m_up).y;
  local_30.z = (rhs->m_up).z;
  bVar12 = ON_3dVector::operator!=(&local_48,&local_30);
  uVar13 = (uint)CONCAT71(extraout_var,bVar12);
  if (bVar12) {
    dVar4 = (lhs->m_angle_range_in_radians).m_t[0];
    dVar5 = (lhs->m_angle_range_in_radians).m_t[1];
    dVar6 = (rhs->m_angle_range_in_radians).m_t[0];
    dVar7 = (rhs->m_angle_range_in_radians).m_t[1];
    if (((dVar4 != dVar6) || (NAN(dVar4) || NAN(dVar6))) ||
       (uVar3 = -(ushort)(dVar5 != dVar7), uVar13 = (uint)uVar3, (uVar3 & 1) != 0)) {
      dVar8 = (lhs->m_hue_range_in_radians).m_t[0];
      dVar9 = (lhs->m_hue_range_in_radians).m_t[1];
      dVar10 = (rhs->m_hue_range_in_radians).m_t[0];
      dVar11 = (rhs->m_hue_range_in_radians).m_t[1];
      if ((((dVar8 != dVar10) || (NAN(dVar8) || NAN(dVar10))) ||
          (uVar3 = -(ushort)(dVar9 != dVar11), uVar13 = (uint)uVar3, (uVar3 & 1) != 0)) &&
         (auVar1._4_4_ = -(uint)NAN(dVar5), auVar1._0_4_ = -(uint)NAN(dVar4),
         auVar1._8_4_ = -(uint)NAN(dVar6), auVar1._12_4_ = -(uint)NAN(dVar7),
         iVar14 = movmskps(uVar13,auVar1), iVar14 == 0)) {
        auVar2._4_4_ = -(uint)NAN(dVar9);
        auVar2._0_4_ = -(uint)NAN(dVar8);
        auVar2._8_4_ = -(uint)NAN(dVar10);
        auVar2._12_4_ = -(uint)NAN(dVar11);
        iVar14 = movmskps(0,auVar2);
        return iVar14 == 0;
      }
    }
  }
  return false;
}

Assistant:

bool operator!=(const ON_SurfaceDraftAngleColorMapping& lhs, const ON_SurfaceDraftAngleColorMapping& rhs)
{
  // if any double is a nan, this compare must be false.
  const ON_3dVector up[2] = { lhs.Up(), rhs.Up() };
  if (up[0] != up[1])
  {
    const ON_Interval ar[2] = { lhs.AngleRangeInRadians() ,rhs.AngleRangeInRadians() };
    if (ar[0].m_t[0] != ar[1].m_t[0] || ar[0].m_t[1] != ar[1].m_t[1])
    {
      const ON_Interval hr[2] = { lhs.HueRangeInRadians() ,rhs.HueRangeInRadians() };
      if (hr[0].m_t[0] != hr[1].m_t[0] || hr[0].m_t[1] != hr[1].m_t[1])
      {
        // any compare involving nans is false
        if (ON_IS_NAN(ar[0].m_t[0]) || ON_IS_NAN(ar[0].m_t[1]) || ON_IS_NAN(ar[1].m_t[0]) || ON_IS_NAN(ar[1].m_t[1]))
          return false;
        if (ON_IS_NAN(hr[0].m_t[0]) || ON_IS_NAN(hr[0].m_t[1]) || ON_IS_NAN(hr[1].m_t[0]) || ON_IS_NAN(hr[1].m_t[1]))
          return false;

        return true;
      }
    }
  }
  return false;
}